

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O0

void ZSTD_ldm_makeEntryAndInsertByTag
               (ldmState_t *ldmState,U64 rollingHash,U32 hBits,U32 offset,ldmParams_t ldmParams)

{
  ldmEntry_t entry_00;
  ldmParams_t ldmParams_00;
  U32 UVar1;
  U32 UVar2;
  U32 UVar3;
  U32 UVar4;
  undefined4 in_ECX;
  U32 in_EDX;
  U64 in_RSI;
  undefined8 in_RDI;
  undefined8 unaff_retaddr;
  U32 in_stack_00000018;
  ldmEntry_t entry;
  U32 checksum;
  U32 hash;
  U32 tagMask;
  U32 tag;
  
  UVar1 = ZSTD_ldm_getTag(in_RSI,in_EDX,in_stack_00000018);
  UVar2 = (1 << ((byte)in_stack_00000018 & 0x1f)) - 1;
  if (UVar1 == UVar2) {
    UVar3 = ZSTD_ldm_getSmallHash(in_RSI,in_EDX);
    UVar4 = ZSTD_ldm_getChecksum(in_RSI,in_EDX);
    entry_00.checksum = UVar1;
    entry_00.offset = UVar2;
    ldmParams_00.bucketSizeLog = (int)in_RDI;
    ldmParams_00.minMatchLength = (int)((ulong)in_RDI >> 0x20);
    ldmParams_00.enableLdm = (int)in_RSI;
    ldmParams_00.hashLog = (int)(in_RSI >> 0x20);
    ldmParams_00._16_8_ = unaff_retaddr;
    ZSTD_ldm_insertEntry
              ((ldmState_t *)CONCAT44(UVar3,UVar4),CONCAT44(UVar4,in_ECX),entry_00,ldmParams_00);
  }
  return;
}

Assistant:

static void ZSTD_ldm_makeEntryAndInsertByTag(ldmState_t* ldmState,
                                             U64 const rollingHash,
                                             U32 const hBits,
                                             U32 const offset,
                                             ldmParams_t const ldmParams)
{
    U32 const tag = ZSTD_ldm_getTag(rollingHash, hBits, ldmParams.hashEveryLog);
    U32 const tagMask = ((U32)1 << ldmParams.hashEveryLog) - 1;
    if (tag == tagMask) {
        U32 const hash = ZSTD_ldm_getSmallHash(rollingHash, hBits);
        U32 const checksum = ZSTD_ldm_getChecksum(rollingHash, hBits);
        ldmEntry_t entry;
        entry.offset = offset;
        entry.checksum = checksum;
        ZSTD_ldm_insertEntry(ldmState, hash, entry, ldmParams);
    }
}